

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O0

void __thiscall
re2::SparseArray<re2::NFA::Thread_*>::create_index(SparseArray<re2::NFA::Thread_*> *this,int i)

{
  int *piVar1;
  IndexValue *pIVar2;
  int in_ESI;
  int *in_RDI;
  int in_stack_ffffffffffffffdc;
  int iVar3;
  undefined4 in_stack_ffffffffffffffe4;
  
  iVar3 = *in_RDI;
  piVar1 = PODArray<int>::operator[]
                     ((PODArray<int> *)CONCAT44(in_stack_ffffffffffffffe4,iVar3),
                      in_stack_ffffffffffffffdc);
  *piVar1 = iVar3;
  pIVar2 = PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::operator[]
                     ((PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue> *)
                      CONCAT44(in_ESI,iVar3),in_stack_ffffffffffffffdc);
  pIVar2->index_ = in_ESI;
  *in_RDI = *in_RDI + 1;
  return;
}

Assistant:

void SparseArray<Value>::create_index(int i) {
  assert(!has_index(i));
  assert(size_ < max_size());
  sparse_[i] = size_;
  dense_[size_].index_ = i;
  size_++;
}